

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

uint decode_pred_count(uint fullsz,int pattern,int esz)

{
  uint64_t uVar1;
  uint local_30;
  uint local_20;
  uint bound;
  uint elements;
  int esz_local;
  int pattern_local;
  uint fullsz_local;
  
  bound._0_1_ = (byte)esz;
  pattern_local = fullsz >> ((byte)bound & 0x1f);
  switch(pattern) {
  case 0:
    uVar1 = pow2floor((ulong)(uint)pattern_local);
    pattern_local = (int)uVar1;
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    local_20 = pattern;
    goto LAB_007db223;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    local_20 = 0x10 << ((char)pattern - 9U & 0x1f);
LAB_007db223:
    if ((uint)pattern_local < local_20) {
      local_30 = 0;
    }
    else {
      local_30 = local_20;
    }
    pattern_local = local_30;
    break;
  default:
    pattern_local = 0;
    break;
  case 0x1d:
    pattern_local = pattern_local - (pattern_local & 3U);
    break;
  case 0x1e:
    pattern_local = pattern_local - (uint)pattern_local % 3;
    break;
  case 0x1f:
  }
  return pattern_local;
}

Assistant:

static unsigned decode_pred_count(unsigned fullsz, int pattern, int esz)
{
    unsigned elements = fullsz >> esz;
    unsigned bound;

    switch (pattern) {
    case 0x0: /* POW2 */
        return pow2floor(elements);
    case 0x1: /* VL1 */
    case 0x2: /* VL2 */
    case 0x3: /* VL3 */
    case 0x4: /* VL4 */
    case 0x5: /* VL5 */
    case 0x6: /* VL6 */
    case 0x7: /* VL7 */
    case 0x8: /* VL8 */
        bound = pattern;
        break;
    case 0x9: /* VL16 */
    case 0xa: /* VL32 */
    case 0xb: /* VL64 */
    case 0xc: /* VL128 */
    case 0xd: /* VL256 */
        bound = 16 << (pattern - 9);
        break;
    case 0x1d: /* MUL4 */
        return elements - elements % 4;
    case 0x1e: /* MUL3 */
        return elements - elements % 3;
    case 0x1f: /* ALL */
        return elements;
    default:   /* #uimm5 */
        return 0;
    }
    return elements >= bound ? bound : 0;
}